

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O1

int __thiscall opencollada::DaeValidator::checkLinks(DaeValidator *this,Dae *dae)

{
  Uri *uri;
  Uri *pUVar1;
  key_type *pkVar2;
  bool bVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *psVar4;
  const_iterator cVar5;
  ostream *poVar6;
  const_iterator cVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  iterator iVar8;
  int iVar9;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *IDREF;
  Uri *this_01;
  key_type *__k;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_ids;
  Uri no_fragment_uri;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Uri local_f8;
  
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"Checking links...",0x11);
  ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + 'H');
  ::std::ostream::put('H');
  ::std::ostream::flush();
  this_00 = &Dae::getIds_abi_cxx11_(dae)->_M_t;
  this_01 = (Uri *)(dae->mAnyURIs).
                   super__Vector_base<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  pUVar1 = (Uri *)(dae->mAnyURIs).
                  super__Vector_base<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 == pUVar1) {
    iVar9 = 0;
  }
  else {
    uri = &dae->mUri;
    iVar9 = 0;
    do {
      Uri::nativePath_abi_cxx11_(&local_f8.mUri,this_01);
      bVar3 = Path::Exists(&local_f8.mUri);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.mUri._M_dataplus._M_p != &local_f8.mUri.field_2) {
        operator_delete(local_f8.mUri._M_dataplus._M_p);
      }
      if (bVar3) {
        psVar4 = Uri::fragment_abi_cxx11_(this_01);
        if (psVar4->_M_string_length != 0) {
          Uri::Uri(&local_f8,this_01);
          local_128._M_impl._0_8_ = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
          Uri::setFragment(&local_f8,(string *)&local_128);
          if ((_Base_ptr *)local_128._M_impl._0_8_ !=
              &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)local_128._M_impl._0_8_);
          }
          bVar3 = Uri::operator==(&local_f8,uri);
          if (bVar3) {
            psVar4 = Uri::fragment_abi_cxx11_(this_01);
            cVar5 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(this_00,psVar4);
            if ((_Rb_tree_header *)cVar5._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
              poVar6 = operator<<((ostream *)&::std::cerr,uri);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
              poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Can\'t resolve #",0x11)
              ;
              psVar4 = Uri::fragment_abi_cxx11_(this_01);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              ::std::ostream::put((char)poVar6);
              iVar9 = 1;
              ::std::ostream::flush();
            }
          }
          else {
            cVar7 = ::std::
                    _Rb_tree<opencollada::Uri,_std::pair<const_opencollada::Uri,_opencollada::Dae>,_std::_Select1st<std::pair<const_opencollada::Uri,_opencollada::Dae>_>,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                    ::find(&(dae->mExternalDAEs)._M_t,&local_f8);
            if ((_Rb_tree_header *)cVar7._M_node !=
                &(dae->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header) {
              bVar3 = XmlDoc::operator_cast_to_bool((XmlDoc *)&cVar7._M_node[7]._M_parent);
              if (bVar3) {
                __x = &Dae::getIds_abi_cxx11_((Dae *)&cVar7._M_node[7]._M_parent)->_M_t;
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_Rb_tree(&local_128,__x);
                psVar4 = Uri::fragment_abi_cxx11_(this_01);
                iVar8 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_128,psVar4);
                if ((_Rb_tree_header *)iVar8._M_node == &local_128._M_impl.super__Rb_tree_header) {
                  poVar6 = operator<<((ostream *)&::std::cerr,uri);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
                  poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,": Can\'t resolve ",0x10);
                  poVar6 = operator<<(poVar6,this_01);
                  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  ::std::ostream::put((char)poVar6);
                  iVar9 = 1;
                  ::std::ostream::flush();
                }
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree(&local_128);
              }
              else {
                poVar6 = operator<<((ostream *)&::std::cerr,uri);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
                poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
                poVar6 = operator<<(poVar6,this_01);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,": referenced file exists but has not been successfully loaded.",
                           0x3e);
                ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                ::std::ostream::put((char)poVar6);
                iVar9 = 1;
                ::std::ostream::flush();
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mFragment._M_dataplus._M_p != &local_f8.mFragment.field_2) {
            operator_delete(local_f8.mFragment._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mQuery._M_dataplus._M_p != &local_f8.mQuery.field_2) {
            operator_delete(local_f8.mQuery._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mPath._M_dataplus._M_p != &local_f8.mPath.field_2) {
            operator_delete(local_f8.mPath._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mAuthority._M_dataplus._M_p != &local_f8.mAuthority.field_2) {
            operator_delete(local_f8.mAuthority._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mScheme._M_dataplus._M_p != &local_f8.mScheme.field_2) {
            operator_delete(local_f8.mScheme._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.mUri._M_dataplus._M_p != &local_f8.mUri.field_2) {
            operator_delete(local_f8.mUri._M_dataplus._M_p);
          }
        }
      }
      else {
        poVar6 = operator<<((ostream *)&::std::cerr,uri);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Can\'t resolve ",0x10);
        poVar6 = operator<<(poVar6,this_01);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        ::std::ostream::put((char)poVar6);
        ::std::ostream::flush();
        iVar9 = 1;
      }
      this_01 = (Uri *)&this_01[1].mUri._M_string_length;
    } while (this_01 != pUVar1);
  }
  __k = (key_type *)
        (dae->mIDREFs).
        super__Vector_base<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pkVar2 = (key_type *)
           (dae->mIDREFs).
           super__Vector_base<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pkVar2) {
    do {
      cVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(this_00,__k);
      if ((_Rb_tree_header *)cVar5._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
        poVar6 = operator<<((ostream *)&::std::cerr,&dae->mUri);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Can\'t resolve #",0x11);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        ::std::ostream::put((char)poVar6);
        ::std::ostream::flush();
        iVar9 = 1;
      }
      __k = (key_type *)&__k[1]._M_string_length;
    } while (__k != pkVar2);
  }
  return iVar9;
}

Assistant:

int DaeValidator::checkLinks(const Dae & dae) const
	{
		cout << "Checking links..." << endl;

		const auto & ids = dae.getIds();

		int result = 0;
		for (const auto & t : dae.getAnyURIs())
		{
			const auto & line = get<0>(t);
			const auto & uri = get<1>(t);
			if (!Path::Exists(uri.nativePath()))
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
				result |= 1;
			}
			else if (!uri.fragment().empty())
			{
				Uri no_fragment_uri(uri);
				no_fragment_uri.setFragment("");
				if (no_fragment_uri == dae.getURI())
				{
					auto id = ids.find(uri.fragment());
					if (id == ids.end())
					{
						cerr << dae.getURI() << ":" << line << ": Can't resolve #" << uri.fragment() << endl;
						result |= 1;
					}
				}
				else
				{
					auto it = dae.getExternalDAEs().find(no_fragment_uri);
					if (it != dae.getExternalDAEs().end())
					{
						if (it->second)
						{
							auto ext_ids = it->second.getIds();
							auto id = ext_ids.find(uri.fragment());
							if (id == ext_ids.end())
							{
								cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
								result |= 1;
							}
						}
						else
						{
							cerr << dae.getURI() << ":" << line << ": " << uri << ": referenced file exists but has not been successfully loaded." << endl;
							result |= 1;
						}
					}
				}
			}
		}

		// IDREF
		for (const auto & IDREF : dae.getIDREFs())
		{
			const auto & line = get<0>(IDREF);
			const auto & idref = get<1>(IDREF);

			auto id = ids.find(idref);
			if (id == ids.end())
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve #" << idref << endl;
				result |= 1;
			}
		}

		return result;
	}